

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O1

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,rect<int> *destRect,rect<int> *clip,SColor *colors,
          u32 timeTicks,bool loop)

{
  uint uVar1;
  long lVar2;
  pointer prVar3;
  ulong uVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined4 uVar6;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  lVar2 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
  uVar8 = (ulong)index;
  if (index < (uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar2) >> 3)
                    * -0x33333333)) {
    uVar10 = (ulong)(*(long *)(lVar2 + 8 + uVar8 * 0x28) - *(long *)(lVar2 + uVar8 * 0x28)) >> 3;
    uVar9 = (uint)uVar10;
    bVar11 = uVar9 != 0;
    uVar7 = 0;
    if (bVar11) {
      uVar1 = *(uint *)(lVar2 + uVar8 * 0x28 + 0x20);
      bVar11 = true;
      if (uVar1 != 0) {
        uVar4 = (ulong)timeTicks / (ulong)uVar1;
        if (loop) {
          uVar7 = uVar4 % (uVar10 & 0xffffffff);
        }
        else {
          uVar7 = (ulong)(uVar9 - 1);
          if ((uint)uVar4 < uVar9) {
            uVar7 = uVar4;
          }
        }
      }
    }
  }
  else {
    bVar11 = false;
    uVar7 = 0;
  }
  if (bVar11) {
    iVar5 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])
                      (this,(ulong)*(uint *)(*(long *)(lVar2 + uVar8 * 0x28) + uVar7 * 8));
    if (CONCAT44(extraout_var,iVar5) != 0) {
      prVar3 = (this->Rectangles).m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = *(uint *)(*(long *)(*(long *)&(this->super_IGUISpriteBank).field_0x8 + uVar8 * 0x28) +
                        4 + uVar7 * 8);
      if (uVar9 < (uint)((ulong)((long)(this->Rectangles).m_data.
                                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)prVar3) >>
                        4)) {
        (*this->Driver->_vptr_IVideoDriver[0x32])
                  (this->Driver,CONCAT44(extraout_var,iVar5),destRect,prVar3 + uVar9,clip,colors,
                   CONCAT44(uVar6,1));
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::rect<s32> &destRect,
		const core::rect<s32> *clip, const video::SColor *const colors,
		u32 timeTicks, bool loop)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, timeTicks, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	Driver->draw2DImage(tex, destRect, Rectangles[rn], clip, colors, true);
}